

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thin_server.c
# Opt level: O0

void thin_data_available(void *cmv,void *conn_datav)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  EVsource source;
  EVsource p_Var5;
  char *__s1;
  ulong size;
  undefined8 *in_RSI;
  int tmp_stone;
  char *comment;
  void *data;
  int format_num_1;
  size_t len;
  FFSTypeHandle next_format_1;
  int format_num;
  FFSTypeHandle target;
  FMStructDescList formats;
  FFSTypeHandle next_format;
  int k;
  int j;
  int i;
  CManager cm;
  thin_conn_data cd;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  EVFreeFunction in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  CManager_conflict in_stack_ffffffffffffffa0;
  int local_2c;
  int local_28;
  int local_24;
  
  IntCManager_unlock(in_stack_ffffffffffffffa0,
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  iVar1 = FFSnext_record_type(*in_RSI);
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  size = (ulong)(iVar1 - 1);
  switch(size) {
  case 0:
  case 1:
    close_FFSfile(*in_RSI);
    free_FFSfile(*in_RSI);
    for (local_24 = 0; local_24 < *(int *)(in_RSI + 2); local_24 = local_24 + 1) {
      local_28 = 0;
      if (*(long *)(in_RSI[3] + (long)local_24 * 8) != 0) {
        while (*(long *)(*(long *)(in_RSI[3] + (long)local_24 * 8) + (long)local_28 * 0x20) != 0) {
          local_2c = 0;
          free(*(void **)(*(long *)(in_RSI[3] + (long)local_24 * 8) + (long)local_28 * 0x20));
          while (*(long *)(*(long *)(*(long *)(in_RSI[3] + (long)local_24 * 8) +
                                     (long)local_28 * 0x20 + 8) + (long)local_2c * 0x18) != 0) {
            free(*(void **)(*(long *)(*(long *)(in_RSI[3] + (long)local_24 * 8) +
                                      (long)local_28 * 0x20 + 8) + (long)local_2c * 0x18));
            free(*(void **)(*(long *)(*(long *)(in_RSI[3] + (long)local_24 * 8) +
                                      (long)local_28 * 0x20 + 8) + (long)local_2c * 0x18 + 8));
            local_2c = local_2c + 1;
          }
          free(*(void **)(*(long *)(in_RSI[3] + (long)local_24 * 8) + (long)local_28 * 0x20 + 8));
          local_28 = local_28 + 1;
        }
        free(*(void **)(in_RSI[3] + (long)local_24 * 8));
      }
    }
    free((void *)in_RSI[3]);
    local_24 = 0;
    while( true ) {
      line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      iVar1 = (int)(size >> 0x20);
      if (*(int *)(in_RSI + 4) < local_24) break;
      if (*(long *)(in_RSI[5] + (long)local_24 * 8) != 0) {
        EVfree_source((EVsource)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
      local_24 = local_24 + 1;
    }
    free((void *)in_RSI[5]);
    CM_fd_remove_select((CManager_conflict)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
    free(in_RSI);
    break;
  case 3:
    uVar2 = FFSnext_type_handle(*in_RSI);
    in_stack_ffffffffffffffa0 = (CManager_conflict)FFSnext_data_length(*in_RSI);
    uVar2 = FMFormat_of_original(uVar2);
    in_stack_ffffffffffffff9c = FMformat_index(uVar2);
    source = (EVsource)INT_CMmalloc(CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    FFSread(*in_RSI,source);
    if (*(int *)(in_RSI + 4) < in_stack_ffffffffffffff9c) {
      pvVar4 = INT_CMrealloc((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             size);
      in_RSI[5] = pvVar4;
      memset((void *)(in_RSI[5] + (long)*(int *)(in_RSI + 4) * 8),0,
             (long)((in_stack_ffffffffffffff9c - *(int *)(in_RSI + 4)) + 1) << 3);
      *(int *)(in_RSI + 4) = in_stack_ffffffffffffff9c;
    }
    if (*(long *)(in_RSI[5] + (long)in_stack_ffffffffffffff9c * 8) == 0) {
      p_Var5 = EVcreate_submit_handle_free
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                          (FMStructDescList)source,in_stack_ffffffffffffff88,
                          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      *(EVsource *)(in_RSI[5] + (long)in_stack_ffffffffffffff9c * 8) = p_Var5;
    }
    EVsubmit(source,in_stack_ffffffffffffff88,
             (attr_list)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    line = (int)((ulong)source >> 0x20);
    break;
  case 7:
    uVar2 = FFSread_format(*in_RSI);
    uVar2 = FMFormat_of_original(uVar2);
    uVar2 = get_localized_formats(uVar2);
    uVar3 = FFSContext_of_file(*in_RSI);
    uVar3 = FFSset_fixed_target(uVar3,uVar2);
    uVar3 = FMFormat_of_original(uVar3);
    iVar1 = FMformat_index(uVar3);
    if (in_RSI[3] == 0) {
      pvVar4 = INT_CMmalloc(CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      in_RSI[3] = pvVar4;
      *(undefined4 *)(in_RSI + 2) = 1;
    }
    if (*(int *)(in_RSI + 2) < iVar1) {
      pvVar4 = INT_CMrealloc((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             size);
      in_RSI[3] = pvVar4;
      memset((void *)(in_RSI[3] + (long)*(int *)(in_RSI + 2) * 8),0,
             (long)((iVar1 - *(int *)(in_RSI + 2)) + 1) << 3);
      *(int *)(in_RSI + 2) = iVar1 + 1;
    }
    *(undefined8 *)(in_RSI[3] + (long)iVar1 * 8) = uVar2;
    break;
  case 0xf:
    __s1 = (char *)FFSread_comment(*in_RSI);
    iVar1 = strncmp(__s1,"Stone ",6);
    if ((iVar1 == 0) &&
       (iVar1 = __isoc99_sscanf(__s1,"Stone %d",&stack0xffffffffffffff84), iVar1 == 1)) {
      *(undefined4 *)((long)in_RSI + 0xc) = in_stack_ffffffffffffff84;
    }
    break;
  case 0x1f:
  }
  IntCManager_lock(in_stack_ffffffffffffffa0,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),line);
  return;
}

Assistant:

static void
thin_data_available(void *cmv, void * conn_datav)
{
    thin_conn_data cd = conn_datav;
    CManager cm = (CManager) cmv;
    int i;

    CManager_unlock(cm);
    switch(FFSnext_record_type(cd->ffsfile)) {
    case FFSindex:
	break;
    case FFSend:
    case FFSerror:
	close_FFSfile(cd->ffsfile);
	free_FFSfile(cd->ffsfile);
	for (i=0; i < cd->format_count; i++) {
	    int j = 0;
	    if (cd->format_list[i] == NULL) continue;
	    while((cd->format_list[i])[j].format_name != NULL) {
		int k = 0;
		free((void*)cd->format_list[i][j].format_name);
		while (cd->format_list[i][j].field_list[k].field_name != NULL) {
		    free((char*)cd->format_list[i][j].field_list[k].field_name);
		    free((char*)cd->format_list[i][j].field_list[k].field_type);
		    k++;
		}
		free(cd->format_list[i][j].field_list);
		j++;
	    }
	    free(cd->format_list[i]);
	}
	free(cd->format_list);
	for (i=0; i <= cd->max_src_list; i++) {
	    if (cd->src_list[i] != NULL) {
		EVfree_source(cd->src_list[i]);
	    }
	}
	free(cd->src_list);
	CM_fd_remove_select(cm, cd->fd);
	free(cd);
	break;
    case FFSformat: {
	FFSTypeHandle next_format = FFSread_format(cd->ffsfile);
	FMStructDescList formats = 
	    get_localized_formats(FMFormat_of_original(next_format));
	FFSTypeHandle target = 
	    FFSset_fixed_target(FFSContext_of_file(cd->ffsfile), 
				formats);
	int format_num = FMformat_index(FMFormat_of_original(target));
	if (cd->format_list == NULL) {
	    cd->format_list = malloc(sizeof(cd->format_list[0]));
	    cd->format_count = 1;
	}
	if (cd->format_count < format_num) {
	    cd->format_list = 
		realloc(cd->format_list, 
			(format_num + 1) * sizeof(cd->format_list[0]));
	    memset(cd->format_list + cd->format_count, 0,
		   sizeof(cd->format_list[0]) * (format_num -cd->format_count +1));
	    cd->format_count = format_num + 1;
	}
	cd->format_list[format_num] = formats;
	break;
    }
    case FFSdata: {
	FFSTypeHandle next_format = FFSnext_type_handle(cd->ffsfile);
	size_t len = FFSnext_data_length(cd->ffsfile);
	int format_num = FMformat_index(FMFormat_of_original(next_format));
	void *data = malloc(len);
	FFSread(cd->ffsfile, data);
	if (cd->max_src_list < format_num) {
	    cd->src_list = realloc(cd->src_list, 
				   (format_num+1) * sizeof(cd->src_list[0]));
	    memset(&cd->src_list[cd->max_src_list], 0,
		   (format_num - cd->max_src_list + 1) * sizeof(cd->src_list[0]));
	    cd->max_src_list = format_num;
	}
	if (cd->src_list[format_num] == NULL) {
	    cd->src_list[format_num] = 
		EVcreate_submit_handle_free(cm, cd->target_stone, 
					    cd->format_list[format_num],
					    thin_free_func, cd);
	}
	EVsubmit(cd->src_list[format_num], data, NULL);
	break;
    }
    case FFScomment: {
	char *comment = FFSread_comment(cd->ffsfile);
	if (strncmp(comment, "Stone ", 6) == 0) {
	    int tmp_stone;
	    if (sscanf(comment, "Stone %d", &tmp_stone) == 1) {
		cd->target_stone = tmp_stone;
	    }
	}
	break;
    }
    }
    CManager_lock(cm);
}